

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

sim_result * analyzeConflict(Abc_Ntk_t *pNtk,int *pModel,int fVerbose)

{
  uint n;
  int iVar1;
  sim_result *psVar2;
  int *piVar3;
  int *piVar4;
  int *__ptr;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  
  iVar8 = pNtk->vPos->nSize;
  n = pNtk->vPis->nSize;
  psVar2 = (sim_result *)malloc(0x20);
  piVar3 = ints(n);
  psVar2->inVec = piVar3;
  piVar4 = ints(iVar8);
  psVar2->outVec = piVar4;
  __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
  for (lVar9 = 0; lVar9 < pNtk->vCis->nSize; lVar9 = lVar9 + 1) {
    pAVar5 = Abc_NtkCi(pNtk,(int)lVar9);
    piVar3[pAVar5->Id - 1] = pModel[lVar9];
  }
  iVar8 = 0;
  for (lVar9 = 0; lVar9 < pNtk->vCos->nSize; lVar9 = lVar9 + 1) {
    pvVar6 = Vec_PtrEntry(pNtk->vCos,(int)lVar9);
    iVar1 = __ptr[lVar9];
    piVar4[*(int *)((long)pvVar6 + 0x10) + ~n] = iVar1;
    iVar8 = (iVar8 + 1) - (uint)(iVar1 == 0);
  }
  psVar2->outVecOnes = iVar8;
  psVar2->activity = 0.0;
  if (fVerbose != 0) {
    for (lVar9 = 0; lVar9 < pNtk->vCis->nSize; lVar9 = lVar9 + 1) {
      pAVar5 = Abc_NtkCi(pNtk,(int)lVar9);
      pcVar7 = Abc_ObjName(pAVar5);
      printf(" %s=%d",pcVar7,(ulong)(uint)pModel[lVar9]);
    }
    putchar(10);
  }
  free(__ptr);
  return psVar2;
}

Assistant:

static struct sim_result *
analyzeConflict( Abc_Ntk_t * pNtk, int * pModel, int fVerbose )
{   
    Abc_Obj_t * pNode;
    int i, count = 0;
    int * pValues;
    struct sim_result * cex;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);
    
    cex = ABC_ALLOC(struct sim_result, 1);  
    cex->inVec = ints( numins );
    cex->outVec =  ints( numouts ); 

    /* get the CO values under this model */
    pValues = Abc_NtkVerifySimulatePattern( pNtk, pModel );    

    Abc_NtkForEachCi( pNtk, pNode, i ) 
        cex->inVec[Abc_ObjId(pNode)-1] = pModel[i];
    Abc_NtkForEachCo( pNtk, pNode, i ) {
        cex->outVec[Abc_ObjId(pNode)-numins-1] = pValues[i];
        if (pValues[i]) count++;
    }   
    
    cex->outVecOnes = count;
    cex->activity = 0;  

    if (fVerbose) {
        Abc_NtkForEachCi( pNtk, pNode, i )
            printf(" %s=%d", Abc_ObjName(pNode), pModel[i]);
        printf("\n");
    }

    ABC_FREE( pValues );    

    return cex;
}